

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool minihttp::SplitURI(string *uri,string *protocol,string *host,string *file,int *port,
                       bool *useSSL)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  string local_50 [32];
  
  pcVar6 = (uri->_M_dataplus)._M_p;
  pcVar3 = strstr(pcVar6,"//");
  *port = -1;
  if (pcVar3 == (char *)0x0) {
    bVar7 = false;
  }
  else {
    uVar4 = std::__cxx11::string::find((char)uri,0x3a);
    uVar5 = std::__cxx11::string::find((char)uri,0x2f);
    if (uVar4 < uVar5) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)uri);
      std::__cxx11::string::operator=((string *)protocol,local_50);
      std::__cxx11::string::~string(local_50);
    }
    iVar1 = strncmp(pcVar6,"http://",7);
    if (iVar1 == 0) {
      iVar2 = 0x50;
    }
    else {
      iVar2 = strncmp(pcVar6,"https://",8);
      if (iVar2 != 0) {
        return false;
      }
      iVar2 = 0x1bb;
    }
    bVar7 = iVar1 != 0;
    *port = iVar2;
    pcVar6 = pcVar3 + 2;
  }
  pcVar6 = strchr(pcVar6,0x2f);
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::assign((char *)host);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)uri);
    std::__cxx11::string::operator=((string *)host,local_50);
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::string::assign((char *)file);
  uVar4 = std::__cxx11::string::find((char)host,0x3a);
  if (uVar4 != 0xffffffffffffffff) {
    iVar1 = atoi((host->_M_dataplus)._M_p + uVar4 + 1);
    *port = iVar1;
    std::__cxx11::string::erase((ulong)host,uVar4);
  }
  *useSSL = bVar7;
  return true;
}

Assistant:

bool SplitURI(const std::string& uri, std::string& protocol, std::string& host, std::string& file, int& port, bool& useSSL)
{
    const char *p = uri.c_str();
    const char *sl = strstr(p, "//");
    unsigned int offs = 0;
    port = -1;
    bool ssl = false;
    if(sl)
    {
        size_t colon = uri.find(':');
        size_t firstslash = uri.find('/');
        if(colon < firstslash)
            protocol = uri.substr(0, colon);
        if(strncmp(p, "http://", 7) == 0)
        {
            offs = 7;
            port = 80;
        }
        else if(strncmp(p, "https://", 8) == 0)
        {
            offs = 8;
            port = 443;
            ssl = true;
        }
        else
            return false;

        p = sl + 2;
    }

    sl = strchr(p, '/');
    if(!sl)
    {
        host = p;
        file = "/";
    }
    else
    {
        host = uri.substr(offs, sl - p);
        file = sl;
    }

    size_t colon = host.find(':');
    if(colon != std::string::npos)
    {
        port = atoi(host.c_str() + colon + 1);
        host.erase(colon);
    }
    useSSL = ssl;

    return true;
}